

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

int google::protobuf::compiler::cpp::anon_unknown_0::popcnt(uint32_t n)

{
  undefined4 local_10;
  undefined4 local_c;
  int result;
  uint32_t n_local;
  
  local_10 = 0;
  for (local_c = n; local_c != 0; local_c = local_c >> 1) {
    local_10 = (local_c & 1) + local_10;
  }
  return local_10;
}

Assistant:

static int popcnt(uint32_t n) {
  int result = 0;
  while (n != 0) {
    result += (n & 1);
    n = n / 2;
  }
  return result;
}